

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::CreateFunctionCallSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType PVar3;
  iterator it;
  bool bVar4;
  ReferenceType pSVar5;
  PointerType pSVar6;
  PointerType pBVar7;
  PointerType pSVar8;
  iterator iVar9;
  iterator iVar10;
  PositionType pos;
  iterator local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [232];
  
  it = originSnapshot.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType((SnapshotDataType *)local_118,pSVar5);
  local_148 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  std::__cxx11::string::~string((string *)(local_118 + 0xa8));
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  (pSVar6->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar6->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->EntryPointLine = entryPointLine;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  std::__cxx11::string::_M_assign((string *)&pSVar6->EntryPointCommand);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->SnapshotType = FunctionCallType;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar9 = pSVar6->ExecutionListFile;
  std::__cxx11::string::string((string *)&local_138,(string *)fileName);
  iVar9 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar9,&local_138);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->ExecutionListFile = iVar9;
  std::__cxx11::string::~string((string *)&local_138);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pBVar7 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar6->BuildSystemDirectory);
  (pBVar7->DirectoryEnd).Tree = local_148.Tree;
  (pBVar7->DirectoryEnd).Position = local_148.Position;
  this_00 = &originSnapshot.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  PVar3 = (pSVar6->Policies).Position;
  (pSVar8->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar8->PolicyScope).Position = PVar3;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  bVar4 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (bVar4) {
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    pcVar1 = (pSVar6->Vars).Tree;
    PVar2 = (pSVar6->Vars).Position;
    iVar10 = pSVar6->Vars;
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    (pSVar6->Parent).Tree = pcVar1;
    (pSVar6->Parent).Position = PVar2;
    iVar10 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar10);
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    pSVar6->Vars = iVar10;
    __return_storage_ptr__->State = this;
    (__return_storage_ptr__->Position).Tree = local_148.Tree;
    (__return_storage_ptr__->Position).Position = local_148.Position;
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x388,
                "cmState::Snapshot cmState::CreateFunctionCallSnapshot(cmState::Snapshot, const std::string &, long, const std::string &)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateFunctionCallSnapshot(cmState::Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine,
                                    std::string const& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = FunctionCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());
  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  return cmState::Snapshot(this, pos);
}